

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void translateBrowsePathToNodeIds
               (UA_Server *server,UA_Session *session,UA_BrowsePath *path,
               UA_BrowsePathResult *result)

{
  UA_NodeStore *ns;
  size_t sVar1;
  size_t sVar2;
  UA_Boolean UVar3;
  UA_StatusCode UVar4;
  int iVar5;
  UA_NodeId *pUVar6;
  UA_NodeId *pUVar7;
  UA_NodeId *pUVar8;
  UA_NodeStoreEntry **ppUVar9;
  UA_Byte *pUVar10;
  UA_Node *pUVar11;
  long *plVar12;
  UA_Byte *pUVar13;
  long lVar14;
  UA_Byte *pUVar15;
  ulong uVar16;
  UA_BrowsePath *pUVar17;
  UA_Byte *pUVar18;
  ulong uVar19;
  UA_NodeId *p;
  UA_ReferenceNode *n1;
  UA_Byte *pUVar20;
  bool bVar21;
  bool bVar22;
  size_t local_98;
  UA_Server *local_90;
  UA_NodeId *local_88;
  UA_NodeId *reftypes;
  UA_Byte *local_78;
  UA_Byte *local_70;
  UA_NodeId *local_68;
  UA_BrowsePath *local_60;
  UA_Byte *local_58;
  UA_Byte *local_50;
  UA_Byte *local_48;
  UA_NodeId *local_40;
  char local_31;
  
  pUVar18 = (session->clientDescription).productUri.data;
  if (pUVar18 == (UA_Byte *)0x0) {
    *(undefined4 *)&path->startingNode = 0x800f0000;
    return;
  }
  plVar12 = (long *)((session->clientDescription).applicationName.locale.length + 0x28);
  bVar21 = true;
  pUVar20 = (UA_Byte *)0x1;
  do {
    if (((short)plVar12[-1] == 0) && (*plVar12 == 0)) {
      *(undefined4 *)&path->startingNode = 0x80600000;
      if (bVar21) {
        return;
      }
      break;
    }
    bVar21 = pUVar20 < pUVar18;
    plVar12 = plVar12 + 7;
    bVar22 = pUVar20 != pUVar18;
    pUVar20 = pUVar20 + 1;
  } while (bVar22);
  local_90 = server;
  pUVar6 = (UA_NodeId *)malloc(0x230);
  (path->startingNode).identifier.string.data = (UA_Byte *)pUVar6;
  if (pUVar6 == (UA_NodeId *)0x0) {
    *(undefined4 *)&path->startingNode = 0x80030000;
    return;
  }
  pUVar7 = (UA_NodeId *)malloc(0xf0);
  if (pUVar7 == (UA_NodeId *)0x0) {
    *(undefined4 *)&path->startingNode = 0x80030000;
LAB_0012319c:
    free(pUVar6);
    return;
  }
  pUVar8 = (UA_NodeId *)malloc(0xf0);
  if (pUVar8 == (UA_NodeId *)0x0) {
    *(undefined4 *)&path->startingNode = 0x80030000;
    free(pUVar6);
    pUVar6 = pUVar7;
    goto LAB_0012319c;
  }
  UVar4 = UA_copy(session,pUVar7,UA_TYPES + 0x10);
  *(UA_StatusCode *)&path->startingNode = UVar4;
  if (UVar4 != 0) {
    free((path->startingNode).identifier.string.data);
    free(pUVar7);
    pUVar6 = pUVar8;
    goto LAB_0012319c;
  }
  local_60 = path;
  local_40 = pUVar7;
  if ((session->clientDescription).productUri.data == (UA_Byte *)0x0) {
    __assert_fail("path->relativePath.elementsSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                  ,0x5ade,
                  "void walkBrowsePath(UA_Server *, UA_Session *, const UA_BrowsePath *, UA_BrowsePathResult *, size_t, UA_NodeId **, size_t *, size_t *, UA_NodeId **, size_t *, size_t *)"
                 );
  }
  local_70 = (UA_Byte *)0x1;
  reftypes = (UA_NodeId *)0x0;
  local_78 = (UA_Byte *)0x0;
  pUVar18 = (UA_Byte *)0xa;
  pUVar20 = (UA_Byte *)0xa;
  pUVar15 = (UA_Byte *)0xa;
  do {
    pUVar13 = pUVar20;
    pUVar6 = local_40;
    lVar14 = (long)local_78 * 0x38;
    p = (UA_NodeId *)((session->clientDescription).applicationName.locale.length + lVar14);
    local_88 = (UA_NodeId *)0x0;
    local_98 = 1;
    local_48 = pUVar15;
    local_31 = UA_NodeId_isNull(p);
    pUVar7 = local_88;
    if (((bool)local_31) || (pUVar7 = p, *(char *)((long)&p[1].namespaceIndex + 1) == '\0')) {
LAB_0012327a:
      local_88 = pUVar7;
      pUVar7 = local_88;
      sVar2 = local_98;
      local_58 = (UA_Byte *)(local_98 - 1);
      local_50 = (UA_Byte *)0x0;
      pUVar10 = (UA_Byte *)0x0;
      pUVar15 = local_48;
      pUVar17 = local_60;
      local_68 = pUVar8;
      do {
        local_40 = (UA_NodeId *)pUVar10;
        ppUVar9 = findNode(local_90->nodestore,pUVar6 + (long)pUVar10);
        if (ppUVar9 == (UA_NodeStoreEntry **)0x0) {
          pUVar11 = (UA_Node *)0x0;
        }
        else {
          pUVar11 = &(*ppUVar9)->node;
        }
        if (pUVar11 == (UA_Node *)0x0) {
          if ((int)local_78 == 0) {
            *(undefined4 *)&pUVar17->startingNode = 0x80340000;
          }
        }
        else if (((reftypes == (UA_NodeId *)0x0) ||
                 (((reftypes->namespaceIndex == (pUVar11->browseName).namespaceIndex &&
                   (sVar1 = (reftypes->identifier).string.length,
                   sVar1 == (pUVar11->browseName).name.length)) &&
                  (iVar5 = bcmp((reftypes->identifier).string.data,(pUVar11->browseName).name.data,
                                sVar1), iVar5 == 0)))) && (pUVar11->referencesSize != 0)) {
          uVar19 = 0;
          do {
            if (*(int *)&pUVar17->startingNode != 0) break;
            if (pUVar11->references[uVar19].isInverse == (UA_Boolean)(char)p[1].namespaceIndex) {
              n1 = pUVar11->references + uVar19;
              if (local_31 == '\0') {
                if (sVar2 == 0) goto LAB_00123505;
                local_48 = pUVar15;
                UVar3 = UA_NodeId_equal(&n1->referenceTypeId,pUVar7);
                pUVar15 = local_48;
                if (!UVar3) {
                  uVar16 = 0;
                  pUVar8 = pUVar7;
                  do {
                    pUVar8 = pUVar8 + 1;
                    pUVar15 = local_48;
                    pUVar17 = local_60;
                    if (local_58 == (UA_Byte *)uVar16) goto LAB_00123505;
                    UVar3 = UA_NodeId_equal(&n1->referenceTypeId,pUVar8);
                    uVar16 = uVar16 + 1;
                  } while (!UVar3);
                  pUVar15 = local_48;
                  pUVar17 = local_60;
                  if (sVar2 <= uVar16) goto LAB_00123505;
                }
              }
              if ((n1->targetId).serverIndex == 0) {
                if (pUVar15 <= local_50) {
                  pUVar8 = (UA_NodeId *)realloc(local_68,(long)pUVar15 * 0x30);
                  if (pUVar8 == (UA_NodeId *)0x0) {
                    *(undefined4 *)&local_60->startingNode = 0x80030000;
                    pUVar17 = local_60;
                    goto LAB_00123505;
                  }
                  pUVar15 = (UA_Byte *)((long)pUVar15 * 2);
                  local_68 = pUVar8;
                }
                pUVar20 = local_50;
                UVar4 = UA_copy(&n1->targetId,local_68 + (long)local_50,UA_TYPES + 0x10);
                *(UA_StatusCode *)&local_60->startingNode = UVar4;
                local_50 = pUVar20 + 1;
                pUVar17 = local_60;
              }
              else {
                local_48 = pUVar15;
                pUVar20 = (UA_Byte *)
                          realloc((pUVar17->startingNode).identifier.string.data,
                                  (long)pUVar18 * 0x70);
                if (pUVar20 == (UA_Byte *)0x0) {
                  *(undefined4 *)&pUVar17->startingNode = 0x80030000;
                  pUVar15 = local_48;
                }
                else {
                  (pUVar17->startingNode).identifier.string.data = pUVar20;
                  pUVar18 = (UA_Byte *)((long)pUVar18 * 2);
                  UVar4 = UA_copy(&n1->targetId,
                                  pUVar20 + (pUVar17->startingNode).identifier.string.length * 0x38,
                                  UA_TYPES + 0x11);
                  *(UA_StatusCode *)&pUVar17->startingNode = UVar4;
                  *(int *)((pUVar17->startingNode).identifier.string.data +
                          (pUVar17->startingNode).identifier.string.length * 0x38 + 0x30) =
                       (int)local_78;
                  pUVar15 = local_48;
                }
              }
            }
LAB_00123505:
            uVar19 = uVar19 + 1;
          } while (uVar19 < pUVar11->referencesSize);
        }
        pUVar8 = local_68;
        pUVar20 = local_70;
        pUVar10 = (UA_Byte *)((long)local_40 + 1);
      } while (pUVar10 != local_70);
      if (local_31 == '\0') {
        if (*(char *)((long)&p[1].namespaceIndex + 1) == '\x01') {
          local_48 = pUVar15;
          UA_Array_delete(local_88,local_98,UA_TYPES + 0x10);
          local_58 = local_48;
          pUVar15 = local_58;
        }
        local_58 = pUVar15;
        local_40 = pUVar8;
      }
      else {
        local_40 = local_68;
        local_58 = pUVar15;
      }
    }
    else {
      ns = local_90->nodestore;
      ppUVar9 = findNode(ns,p);
      if (ppUVar9 == (UA_NodeStoreEntry **)0x0) {
        pUVar11 = (UA_Node *)0x0;
      }
      else {
        pUVar11 = &(*ppUVar9)->node;
      }
      if ((pUVar11 == (UA_Node *)0x0) || (pUVar11->nodeClass != UA_NODECLASS_REFERENCETYPE)) {
        local_58 = local_48;
        local_50 = (UA_Byte *)0x0;
        pUVar20 = local_70;
        local_40 = pUVar8;
      }
      else {
        UVar4 = getTypeHierarchy(ns,pUVar11,false,&local_88,&local_98);
        pUVar7 = local_88;
        if (UVar4 == 0) goto LAB_0012327a;
        local_58 = local_48;
        local_50 = (UA_Byte *)0x0;
        pUVar20 = local_70;
        local_40 = pUVar8;
      }
    }
    pUVar20 = pUVar20 + (pUVar20 == (UA_Byte *)0x0);
    pUVar7 = pUVar6;
    do {
      deleteMembers_noInit(pUVar7,UA_TYPES + 0x10);
      pUVar17 = local_60;
      pUVar7->namespaceIndex = 0;
      *(undefined2 *)&pUVar7->field_0x2 = 0;
      pUVar7->identifierType = UA_NODEIDTYPE_NUMERIC;
      (pUVar7->identifier).string.length = 0;
      (pUVar7->identifier).string.data = (UA_Byte *)0x0;
      pUVar7 = pUVar7 + 1;
      pUVar20 = pUVar20 + -1;
    } while (pUVar20 != (UA_Byte *)0x0);
    if (local_50 == (UA_Byte *)0x0) {
      pUVar7 = pUVar6;
      pUVar18 = (UA_Byte *)0x0;
      pUVar6 = local_40;
      goto LAB_0012383b;
    }
    if (*(int *)&local_60->startingNode != 0) {
      __assert_fail("*nextCount == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                    ,0x5aed,
                    "void walkBrowsePath(UA_Server *, UA_Session *, const UA_BrowsePath *, UA_BrowsePathResult *, size_t, UA_NodeId **, size_t *, size_t *, UA_NodeId **, size_t *, size_t *)"
                   );
    }
    reftypes = (UA_NodeId *)
               ((session->clientDescription).applicationName.locale.length + lVar14 + 0x20);
    local_78 = (UA_Byte *)(ulong)((int)local_78 + 1);
    local_70 = local_50;
    pUVar20 = local_58;
    pUVar15 = pUVar13;
    pUVar8 = pUVar6;
  } while (local_78 < (session->clientDescription).productUri.data);
  if (pUVar18 < local_50 + (local_60->startingNode).identifier.string.length) {
    pUVar20 = (UA_Byte *)
              realloc((local_60->startingNode).identifier.string.data,
                      (long)(local_50 + (local_60->startingNode).identifier.string.length) * 0x38);
    if (pUVar20 == (UA_Byte *)0x0) {
      *(undefined4 *)&pUVar17->startingNode = 0x80030000;
      pUVar7 = local_40;
      pUVar18 = local_50;
      local_58 = pUVar20;
      do {
        deleteMembers_noInit(pUVar7,UA_TYPES + 0x10);
        pUVar7->namespaceIndex = 0;
        *(undefined2 *)&pUVar7->field_0x2 = 0;
        pUVar7->identifierType = UA_NODEIDTYPE_NUMERIC;
        (pUVar7->identifier).string.length = 0;
        (pUVar7->identifier).string.data = (UA_Byte *)0x0;
        pUVar7 = pUVar7 + 1;
        pUVar18 = pUVar18 + -1;
      } while (pUVar18 != (UA_Byte *)0x0);
      local_50 = (UA_Byte *)0x0;
      pUVar20 = local_58;
    }
    else {
      (pUVar17->startingNode).identifier.string.data = pUVar20;
    }
    pUVar7 = local_40;
    pUVar18 = local_50;
    if (pUVar20 == (UA_Byte *)0x0) goto LAB_0012383b;
  }
  pUVar7 = local_40;
  pUVar18 = local_50;
  if (local_50 == (UA_Byte *)0x0) {
    pUVar18 = (UA_Byte *)0x0;
  }
  else {
    do {
      ppUVar9 = findNode(local_90->nodestore,pUVar7);
      if (ppUVar9 == (UA_NodeStoreEntry **)0x0) {
        pUVar11 = (UA_Node *)0x0;
      }
      else {
        pUVar11 = &(*ppUVar9)->node;
      }
      if (((pUVar11 == (UA_Node *)0x0) ||
          (reftypes->namespaceIndex != (pUVar11->browseName).namespaceIndex)) ||
         ((sVar1 = (reftypes->identifier).string.length, sVar1 != (pUVar11->browseName).name.length
          || (iVar5 = bcmp((reftypes->identifier).string.data,(pUVar11->browseName).name.data,sVar1)
             , iVar5 != 0)))) {
        deleteMembers_noInit(pUVar7,UA_TYPES + 0x10);
        pUVar7->namespaceIndex = 0;
        *(undefined2 *)&pUVar7->field_0x2 = 0;
        pUVar7->identifierType = UA_NODEIDTYPE_NUMERIC;
        (pUVar7->identifier).string.length = 0;
        (pUVar7->identifier).string.data = (UA_Byte *)0x0;
      }
      else {
        pUVar15 = (pUVar17->startingNode).identifier.string.data;
        lVar14 = (pUVar17->startingNode).identifier.string.length * 0x38;
        pUVar20 = pUVar15 + lVar14 + 0x20;
        pUVar20[0] = '\0';
        pUVar20[1] = '\0';
        pUVar20[2] = '\0';
        pUVar20[3] = '\0';
        pUVar20[4] = '\0';
        pUVar20[5] = '\0';
        pUVar20[6] = '\0';
        pUVar20[7] = '\0';
        pUVar20[8] = '\0';
        pUVar20[9] = '\0';
        pUVar20[10] = '\0';
        pUVar20[0xb] = '\0';
        pUVar20[0xc] = '\0';
        pUVar20[0xd] = '\0';
        pUVar20[0xe] = '\0';
        pUVar20[0xf] = '\0';
        pUVar20 = pUVar15 + lVar14 + 0x10;
        pUVar20[0] = '\0';
        pUVar20[1] = '\0';
        pUVar20[2] = '\0';
        pUVar20[3] = '\0';
        pUVar20[4] = '\0';
        pUVar20[5] = '\0';
        pUVar20[6] = '\0';
        pUVar20[7] = '\0';
        pUVar20[8] = '\0';
        pUVar20[9] = '\0';
        pUVar20[10] = '\0';
        pUVar20[0xb] = '\0';
        pUVar20[0xc] = '\0';
        pUVar20[0xd] = '\0';
        pUVar20[0xe] = '\0';
        pUVar20[0xf] = '\0';
        pUVar20 = pUVar15 + lVar14;
        pUVar20[0] = '\0';
        pUVar20[1] = '\0';
        pUVar20[2] = '\0';
        pUVar20[3] = '\0';
        pUVar20[4] = '\0';
        pUVar20[5] = '\0';
        pUVar20[6] = '\0';
        pUVar20[7] = '\0';
        pUVar20[8] = '\0';
        pUVar20[9] = '\0';
        pUVar20[10] = '\0';
        pUVar20[0xb] = '\0';
        pUVar20[0xc] = '\0';
        pUVar20[0xd] = '\0';
        pUVar20[0xe] = '\0';
        pUVar20[0xf] = '\0';
        pUVar15 = pUVar15 + lVar14 + 0x30;
        pUVar15[0] = '\0';
        pUVar15[1] = '\0';
        pUVar15[2] = '\0';
        pUVar15[3] = '\0';
        pUVar15[4] = '\0';
        pUVar15[5] = '\0';
        pUVar15[6] = '\0';
        pUVar15[7] = '\0';
        pUVar20 = (pUVar17->startingNode).identifier.string.data;
        lVar14 = (pUVar17->startingNode).identifier.string.length * 0x38;
        *(UA_Byte **)(pUVar20 + lVar14 + 0x10) = (pUVar7->identifier).string.data;
        sVar2 = (pUVar7->identifier).string.length;
        pUVar20 = pUVar20 + lVar14;
        *(undefined8 *)pUVar20 = *(undefined8 *)pUVar7;
        *(size_t *)(pUVar20 + 8) = sVar2;
        sVar2 = (pUVar17->startingNode).identifier.string.length;
        pUVar20 = (pUVar17->startingNode).identifier.string.data + sVar2 * 0x38 + 0x30;
        pUVar20[0] = 0xff;
        pUVar20[1] = 0xff;
        pUVar20[2] = 0xff;
        pUVar20[3] = 0xff;
        (pUVar17->startingNode).identifier.string.length = sVar2 + 1;
      }
      pUVar18 = pUVar18 + -1;
      pUVar7 = pUVar7 + 1;
    } while (pUVar18 != (UA_Byte *)0x0);
    pUVar7 = local_40;
    pUVar18 = (UA_Byte *)0x0;
  }
LAB_0012383b:
  if (pUVar18 == (UA_Byte *)0x0) {
    if (((pUVar17->startingNode).identifier.string.length == 0) &&
       (*(int *)&pUVar17->startingNode == 0)) {
      *(undefined4 *)&pUVar17->startingNode = 0x806f0000;
    }
    free(pUVar7);
    free(pUVar6);
    if (*(int *)&pUVar17->startingNode != 0) {
      local_40 = (UA_NodeId *)&(pUVar17->startingNode).identifier;
      if (((UA_String *)local_40)->length != 0) {
        lVar14 = 0;
        uVar19 = 0;
        do {
          pUVar20 = (pUVar17->startingNode).identifier.string.data;
          deleteMembers_noInit(pUVar20 + lVar14,UA_TYPES + 0x1a);
          pUVar18 = pUVar20 + lVar14 + 0x20;
          pUVar18[0] = '\0';
          pUVar18[1] = '\0';
          pUVar18[2] = '\0';
          pUVar18[3] = '\0';
          pUVar18[4] = '\0';
          pUVar18[5] = '\0';
          pUVar18[6] = '\0';
          pUVar18[7] = '\0';
          pUVar18[8] = '\0';
          pUVar18[9] = '\0';
          pUVar18[10] = '\0';
          pUVar18[0xb] = '\0';
          pUVar18[0xc] = '\0';
          pUVar18[0xd] = '\0';
          pUVar18[0xe] = '\0';
          pUVar18[0xf] = '\0';
          pUVar18 = pUVar20 + lVar14 + 0x10;
          pUVar18[0] = '\0';
          pUVar18[1] = '\0';
          pUVar18[2] = '\0';
          pUVar18[3] = '\0';
          pUVar18[4] = '\0';
          pUVar18[5] = '\0';
          pUVar18[6] = '\0';
          pUVar18[7] = '\0';
          pUVar18[8] = '\0';
          pUVar18[9] = '\0';
          pUVar18[10] = '\0';
          pUVar18[0xb] = '\0';
          pUVar18[0xc] = '\0';
          pUVar18[0xd] = '\0';
          pUVar18[0xe] = '\0';
          pUVar18[0xf] = '\0';
          pUVar18 = pUVar20 + lVar14;
          pUVar18[0] = '\0';
          pUVar18[1] = '\0';
          pUVar18[2] = '\0';
          pUVar18[3] = '\0';
          pUVar18[4] = '\0';
          pUVar18[5] = '\0';
          pUVar18[6] = '\0';
          pUVar18[7] = '\0';
          pUVar18[8] = '\0';
          pUVar18[9] = '\0';
          pUVar18[10] = '\0';
          pUVar18[0xb] = '\0';
          pUVar18[0xc] = '\0';
          pUVar18[0xd] = '\0';
          pUVar18[0xe] = '\0';
          pUVar18[0xf] = '\0';
          pUVar20 = pUVar20 + lVar14 + 0x30;
          pUVar20[0] = '\0';
          pUVar20[1] = '\0';
          pUVar20[2] = '\0';
          pUVar20[3] = '\0';
          pUVar20[4] = '\0';
          pUVar20[5] = '\0';
          pUVar20[6] = '\0';
          pUVar20[7] = '\0';
          uVar19 = uVar19 + 1;
          lVar14 = lVar14 + 0x38;
        } while (uVar19 < (pUVar17->startingNode).identifier.string.length);
      }
      free((pUVar17->startingNode).identifier.string.data);
      *(size_t *)&local_40->namespaceIndex = 0;
      *(UA_Byte **)&local_40->identifier = (UA_Byte *)0x0;
    }
    return;
  }
  __assert_fail("currentCount == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                ,0x5b51,
                "void translateBrowsePathToNodeIds(UA_Server *, UA_Session *, const UA_BrowsePath *, UA_BrowsePathResult *)"
               );
}

Assistant:

static void
translateBrowsePathToNodeIds(UA_Server *server, UA_Session *session,
                             const UA_BrowsePath *path, UA_BrowsePathResult *result) {
    if(path->relativePath.elementsSize <= 0) {
        result->statusCode = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }
        
    /* RelativePath elements must not have an empty targetName */
    for(size_t i = 0; i < path->relativePath.elementsSize; ++i) {
        if(UA_QualifiedName_isNull(&path->relativePath.elements[i].targetName)) {
            result->statusCode = UA_STATUSCODE_BADBROWSENAMEINVALID;
            return;
        }
    }

    /* Allocate memory for the targets */
    size_t targetsSize = 10; /* When to realloc; the member count is stored in
                              * result->targetsSize */
    result->targets = (UA_BrowsePathTarget*)UA_malloc(sizeof(UA_BrowsePathTarget) * targetsSize);
    if(!result->targets) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }

    /* Allocate memory for two temporary arrays. One with the results for the
     * previous depth of the path. The other for the new results at the current
     * depth. The two arrays alternate as we descend down the tree. */
    size_t currentSize = 10; /* When to realloc */
    size_t currentCount = 0; /* Current elements */
    UA_NodeId *current = (UA_NodeId*)UA_malloc(sizeof(UA_NodeId) * currentSize);
    if(!current) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        UA_free(result->targets);
        return;
    }
    size_t nextSize = 10; /* When to realloc */
    size_t nextCount = 0; /* Current elements */
    UA_NodeId *next = (UA_NodeId*)UA_malloc(sizeof(UA_NodeId) * nextSize);
    if(!next) {
        result->statusCode = UA_STATUSCODE_BADOUTOFMEMORY;
        UA_free(result->targets);
        UA_free(current);
        return;
    }

    /* Copy the starting node into current */
    result->statusCode = UA_NodeId_copy(&path->startingNode, &current[0]);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        UA_free(result->targets);
        UA_free(current);
        UA_free(next);
        return;
    }
    currentCount = 1;

    /* Walk the path elements */
    walkBrowsePath(server, session, path, result, targetsSize,
                   &current, &currentSize, &currentCount,
                   &next, &nextSize, &nextCount);

    UA_assert(currentCount == 0);
    UA_assert(nextCount == 0);

    /* No results => BadNoMatch status code */
    if(result->targetsSize == 0 && result->statusCode == UA_STATUSCODE_GOOD)
        result->statusCode = UA_STATUSCODE_BADNOMATCH;

    /* Clean up the temporary arrays and the targets */
    UA_free(current);
    UA_free(next);
    if(result->statusCode != UA_STATUSCODE_GOOD) {
        for(size_t i = 0; i < result->targetsSize; ++i)
            UA_BrowsePathTarget_deleteMembers(&result->targets[i]);
        UA_free(result->targets);
        result->targets = NULL;
        result->targetsSize = 0;
    }
}